

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_finalize_encoded_frame(AV1_COMP *cpi)

{
  char *pcVar1;
  char *pcVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  SequenceHeader *pSVar6;
  RefCntBuffer *pRVar7;
  RefCntBuffer *pRVar8;
  uint16_t uVar9;
  int i_1;
  int iVar10;
  int iVar11;
  uint *puVar12;
  uint16_t uVar13;
  int i;
  long lVar14;
  uint uVar15;
  long extraout_RDX;
  ulong uVar16;
  int iVar17;
  long in_RSI;
  long lVar18;
  int iVar19;
  int x_start;
  bool bVar20;
  bool bVar21;
  int iVar22;
  double dVar23;
  int iVar24;
  int iVar25;
  int count [3];
  int iStack_80;
  int iStack_7c;
  int local_28 [4];
  
  pSVar6 = (cpi->common).seq_params;
  iVar19 = (cpi->common).show_existing_frame;
  if (pSVar6->reduced_still_picture_hdr == '\0') {
    if (iVar19 != 0) {
      if (((cpi->common).features.error_resilient_mode != true) ||
         ((cpi->common).current_frame.frame_type == '\0')) {
        pRVar7 = (cpi->common).ref_frame_map[cpi->existing_fb_idx_to_show];
        if (pRVar7 == (RefCntBuffer *)0x0) {
          av1_finalize_encoded_frame_cold_1();
          iVar19 = *(int *)&cpi->field_0x8;
          iStack_80 = 0;
          iStack_7c = 0;
          iVar22 = 0;
          if (7 < iVar19) {
            iVar17 = *(int *)&cpi->ppi;
            iVar22 = 0;
            iStack_7c = 0;
            iStack_80 = 0;
            iVar24 = 0;
            iVar25 = 8;
            do {
              if (7 < iVar17) {
                iVar11 = 8;
                x_start = 0;
                do {
                  iVar10 = iVar11;
                  iVar11 = *(int *)(cpi->enc_quant_dequant_params).quants.y_quant[1];
                  iVar5 = *(int *)(in_RSI + 0x20);
                  lVar14 = (long)(iVar11 * iVar24 + x_start) +
                           *(long *)((cpi->enc_quant_dequant_params).quants.y_quant[1] + 4);
                  lVar18 = (long)(iVar5 * iVar24 + x_start) + *(long *)(in_RSI + 0x28);
                  if (((cpi->enc_quant_dequant_params).quants.y_quant[0xb][0] & 8) == 0) {
                    uVar15 = 0;
                    do {
                      uVar16 = 0;
                      do {
                        pcVar1 = (char *)(lVar14 + uVar16);
                        pcVar2 = (char *)(lVar18 + uVar16);
                        bVar21 = *pcVar1 == *pcVar2;
                        if (!bVar21) break;
                        bVar20 = uVar16 < 7;
                        uVar16 = uVar16 + 1;
                      } while (bVar20);
                      if (*pcVar1 != *pcVar2) break;
                      lVar14 = lVar14 + iVar11;
                      lVar18 = lVar18 + iVar5;
                      bVar20 = uVar15 < 7;
                      uVar15 = uVar15 + 1;
                    } while (bVar20);
                  }
                  else {
                    lVar14 = lVar14 * 2;
                    lVar18 = lVar18 * 2;
                    uVar15 = 0;
                    do {
                      uVar16 = 0;
                      do {
                        sVar3 = *(short *)(lVar14 + uVar16 * 2);
                        sVar4 = *(short *)(lVar18 + uVar16 * 2);
                        bVar21 = sVar3 == sVar4;
                        if (!bVar21) break;
                        bVar20 = uVar16 < 7;
                        uVar16 = uVar16 + 1;
                      } while (bVar20);
                      if (sVar3 != sVar4) break;
                      lVar18 = lVar18 + (long)iVar5 * 2;
                      lVar14 = lVar14 + (long)iVar11 * 2;
                      bVar20 = uVar15 < 7;
                      uVar15 = uVar15 + 1;
                    } while (bVar20);
                  }
                  if (bVar21) {
                    iStack_7c = iStack_7c + 1;
                  }
                  else {
                    iVar11 = av1_hash_is_horizontal_perfect
                                       ((YV12_BUFFER_CONFIG *)cpi,8,x_start,iVar24);
                    if ((iVar11 != 0) ||
                       (iVar11 = av1_hash_is_vertical_perfect
                                           ((YV12_BUFFER_CONFIG *)cpi,8,x_start,iVar24), iVar11 != 0
                       )) {
                      iStack_80 = iStack_80 + 1;
                    }
                  }
                  iVar22 = iVar22 + 1;
                  iVar11 = iVar10 + 8;
                  x_start = iVar10;
                } while (iVar11 <= iVar17);
              }
              iVar11 = iVar25 + 8;
              iVar24 = iVar25;
              iVar25 = iVar11;
            } while (iVar11 <= iVar19);
          }
          dVar23 = (double)(iStack_80 + iStack_7c) / (double)iVar22;
          iVar19 = *(int *)(extraout_RDX + 0x100);
          *(double *)(extraout_RDX + (long)iVar19 * 8) = dVar23;
          uVar15 = iVar19 + 0x20;
          if (-1 < (int)(iVar19 + 1U)) {
            uVar15 = iVar19 + 1U;
          }
          *(uint *)(extraout_RDX + 0x100) = (iVar19 - (uVar15 & 0xffffffe0)) + 1;
          uVar15 = 0x20;
          if (*(int *)(extraout_RDX + 0x104) < 0x1f) {
            uVar15 = *(int *)(extraout_RDX + 0x104) + 1;
          }
          *(uint *)(extraout_RDX + 0x104) = uVar15;
          if (((0.8 <= dVar23) && (iStack_7c != iVar22)) && (0 < (int)uVar15)) {
            uVar16 = 0;
            do {
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          return;
        }
        pRVar8 = (cpi->common).cur_frame;
        if (pRVar8 != (RefCntBuffer *)0x0) {
          pRVar8->ref_count = pRVar8->ref_count + -1;
        }
        (cpi->common).cur_frame = pRVar7;
        pRVar7->ref_count = pRVar7->ref_count + 1;
      }
      goto LAB_001b9ee6;
    }
  }
  else if (iVar19 != 0) {
LAB_001b9ee6:
    if (((cpi->common).features.error_resilient_mode != true) ||
       ((cpi->common).current_frame.frame_type == '\0')) goto LAB_001b9f64;
  }
  if ((pSVar6->film_grain_params_present != '\0') &&
     (((cpi->common).show_frame != 0 || ((cpi->common).showable_frame != 0)))) {
    memcpy(&((cpi->common).cur_frame)->film_grain_params,&(cpi->common).film_grain_params,0x288);
    if ((cpi->common).current_frame.frame_type != '\x01') {
      (((cpi->common).cur_frame)->film_grain_params).update_parameters = 1;
    }
    uVar9 = (short)*(undefined4 *)&(cpi->common).film_grain_params.random_seed + 0xd35;
    uVar13 = 0x1cdf;
    if (uVar9 != 0) {
      uVar13 = uVar9;
    }
    (cpi->common).film_grain_params.random_seed = uVar13;
  }
LAB_001b9f64:
  iVar19 = (cpi->common).tiles.cols;
  if (0 < iVar19) {
    iVar22 = (cpi->common).tiles.rows;
    iVar17 = 0;
    do {
      if (0 < iVar22) {
        iVar19 = 0;
        do {
          memcpy(&cpi->tile_data[(cpi->common).tiles.cols * iVar19 + iVar17].tctx,(cpi->common).fc,
                 0x52fc);
          iVar19 = iVar19 + 1;
          iVar22 = (cpi->common).tiles.rows;
        } while (iVar19 < iVar22);
        iVar19 = (cpi->common).tiles.cols;
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < iVar19);
  }
  if ((((cpi->common).current_frame.frame_type & 0xfd) != 0) &&
     ((cpi->common).features.interp_filter == MULTITAP_SHARP2)) {
    puVar12 = (uint *)(cpi->td).counts;
    local_28[2] = 0;
    local_28[0] = 0;
    local_28[1] = 0;
    lVar14 = 0;
    iVar19 = 0;
    do {
      iVar22 = local_28[lVar14];
      iVar17 = 0;
      iVar24 = 0;
      iVar25 = 0;
      lVar18 = 0x24;
      do {
        iVar22 = iVar22 + *(int *)((long)puVar12 + lVar18 + -0x24);
        iVar17 = iVar17 + *(int *)((long)puVar12 + lVar18 + -0x18);
        iVar24 = iVar24 + *(int *)((long)puVar12 + lVar18 + -0xc);
        iVar25 = iVar25 + *(int *)((long)puVar12 + lVar18);
        lVar18 = lVar18 + 0x30;
      } while (lVar18 != 0xe4);
      iVar22 = iVar25 + iVar17 + iVar24 + iVar22;
      local_28[lVar14] = iVar22;
      iVar19 = iVar19 + (uint)(0 < iVar22);
      lVar14 = lVar14 + 1;
      puVar12 = puVar12 + 1;
    } while (lVar14 != 3);
    if (iVar19 == 1) {
      lVar14 = 0;
      do {
        if (local_28[lVar14] != 0) {
          (cpi->common).features.interp_filter = (InterpFilter)lVar14;
          return;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
    }
  }
  return;
}

Assistant:

void av1_finalize_encoded_frame(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;

  if (!cm->seq_params->reduced_still_picture_hdr &&
      encode_show_existing_frame(cm)) {
    RefCntBuffer *const frame_to_show =
        cm->ref_frame_map[cpi->existing_fb_idx_to_show];

    if (frame_to_show == NULL) {
      aom_internal_error(cm->error, AOM_CODEC_UNSUP_BITSTREAM,
                         "Buffer does not contain a reconstructed frame");
    }
    assert(frame_to_show->ref_count > 0);
    assign_frame_buffer_p(&cm->cur_frame, frame_to_show);
  }

  if (!encode_show_existing_frame(cm) &&
      cm->seq_params->film_grain_params_present &&
      (cm->show_frame || cm->showable_frame)) {
    // Copy the current frame's film grain params to the its corresponding
    // RefCntBuffer slot.
    cm->cur_frame->film_grain_params = cm->film_grain_params;

    // We must update the parameters if this is not an INTER_FRAME
    if (current_frame->frame_type != INTER_FRAME)
      cm->cur_frame->film_grain_params.update_parameters = 1;

    // Iterate the random seed for the next frame.
    cm->film_grain_params.random_seed += 3381;
    if (cm->film_grain_params.random_seed == 0)
      cm->film_grain_params.random_seed = 7391;
  }

  // Initialise all tiles' contexts from the global frame context
  for (int tile_col = 0; tile_col < cm->tiles.cols; tile_col++) {
    for (int tile_row = 0; tile_row < cm->tiles.rows; tile_row++) {
      const int tile_idx = tile_row * cm->tiles.cols + tile_col;
      cpi->tile_data[tile_idx].tctx = *cm->fc;
    }
  }

  if (!frame_is_intra_only(cm))
    fix_interp_filter(&cm->features.interp_filter, cpi->td.counts);
}